

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_htmlIsAutoClosed(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_60;
  PyObject *local_58;
  undefined *local_50;
  PyObject *pyobj_elem;
  htmlNodePtr elem;
  PyObject *pyobj_doc;
  htmlDocPtr doc;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("htmlIsAutoClosed");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT(py_retval,"OO:htmlIsAutoClosed",&elem,&local_50);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (elem == (htmlNodePtr)&_Py_NoneStruct) {
        local_58 = (PyObject *)0x0;
      }
      else {
        local_58 = (PyObject *)elem->name;
      }
      pyobj_doc = local_58;
      if (local_50 == &_Py_NoneStruct) {
        local_60 = (PyObject *)0x0;
      }
      else {
        local_60 = *(PyObject **)(local_50 + 0x10);
      }
      pyobj_elem = local_60;
      doc._4_4_ = htmlIsAutoClosed(local_58,local_60);
      self_local = libxml_intWrap(doc._4_4_);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_htmlIsAutoClosed(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    htmlDocPtr doc;
    PyObject *pyobj_doc;
    htmlNodePtr elem;
    PyObject *pyobj_elem;

    if (libxml_deprecationWarning("htmlIsAutoClosed") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"OO:htmlIsAutoClosed", &pyobj_doc, &pyobj_elem))
        return(NULL);
    doc = (htmlDocPtr) PyxmlNode_Get(pyobj_doc);
    elem = (htmlNodePtr) PyxmlNode_Get(pyobj_elem);

    c_retval = htmlIsAutoClosed(doc, elem);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}